

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC4862(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffc8;
  bool local_19;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *obj;
  
  obj = *(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  bVar1 = IsIPv6(in_stack_ffffffffffffffc8);
  local_19 = false;
  if (bVar1) {
    local_19 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,8ul>
                         (obj,(array<unsigned_char,_8UL> *)0x80fe);
  }
  if (*(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) != obj) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool CNetAddr::IsRFC4862() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 8>{0xFE, 0x80, 0x00, 0x00,
                                                                0x00, 0x00, 0x00, 0x00});
}